

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O0

string * __thiscall ExprPrinter::OnUnary(ExprPrinter *this,Kind kind,string *arg)

{
  Kind in_EDX;
  string *in_RDI;
  undefined4 in_stack_00000030;
  char *in_stack_00000040;
  ExprPrinter *in_stack_00000048;
  
  if (in_EDX == FIRST_UNARY) {
    format<std::__cxx11::string>
              (in_stack_00000048,in_stack_00000040,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  else {
    mp::expr::str(in_EDX);
    format<char_const*,std::__cxx11::string>
              (in_stack_00000048,in_stack_00000040,(char **)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(kind,in_stack_00000030));
  }
  return in_RDI;
}

Assistant:

std::string OnUnary(expr::Kind kind, std::string arg) {
    return kind == expr::MINUS ?
          format("-{}", arg) : format("{}({})", expr::str(kind), arg);
  }